

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalCanonicalizeRealPath(LPCSTR lpUnixPath,LPSTR lpBuffer,DWORD cch)

{
  long lVar1;
  DWORD DVar2;
  bool bVar3;
  int iVar4;
  DWORD DVar5;
  errno_t eVar6;
  char *__s;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar11;
  long in_FS_OFFSET;
  char local_1048 [8];
  char pszCwdBuffer [4097];
  size_t sVar10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((lpBuffer == (LPSTR)0x0 || lpUnixPath == (LPCSTR)0x0) || cch < 0x1000) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_0031e881;
    DVar5 = 0x57;
  }
  else {
    __s = InternalStrdup(lpUnixPath);
    if (__s != (char *)0x0) {
      pcVar7 = strrchr(__s,0x2f);
      if (pcVar7 == (char *)0x0) {
        pcVar7 = getcwd(local_1048,0x1001);
        if (pcVar7 == (char *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031e881;
          DVar5 = DIRGetLastErrorFromErrno();
        }
        else {
          pcVar7 = realpath(local_1048,lpBuffer);
          pcVar9 = __s;
          if (pcVar7 != (char *)0x0) goto LAB_0031e72d;
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031e881;
          DVar5 = FILEGetLastErrorFromErrno();
          if (DVar5 == 2) {
            pcVar7 = strstr(local_1048,lpBuffer);
            DVar5 = 3 - (pcVar7 == (char *)0x0);
          }
        }
        bVar3 = true;
      }
      else {
        pcVar9 = pcVar7;
        pcVar11 = pcVar7;
        if (pcVar7 == __s) {
          sVar8 = strlen(__s);
          pcVar11 = __s + sVar8;
          pcVar9 = lpBuffer;
        }
        *pcVar9 = '\0';
        pcVar9 = realpath(__s,lpBuffer);
        if (pcVar9 == (char *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031e881;
          DVar5 = FILEGetLastErrorFromErrno();
          bVar3 = true;
          if (DVar5 == 2) {
            pcVar7 = strstr(__s,lpBuffer);
            DVar5 = 3 - (pcVar7 == (char *)0x0);
            bVar3 = true;
          }
        }
        else {
          pcVar9 = (char *)0x0;
          if (pcVar7 != __s) {
            pcVar9 = pcVar11 + 1;
          }
LAB_0031e72d:
          sVar8 = strlen(lpBuffer);
          if (pcVar9 == (char *)0x0) {
            iVar4 = 0;
          }
          else {
            sVar10 = strlen(pcVar9);
            iVar4 = (int)sVar10;
          }
          if (iVar4 + (int)sVar8 + 2U <= cch) {
            lpBuffer[sVar8 & 0xffffffff] = '/';
            lpBuffer[(int)sVar8 + 1] = '\0';
            if ((pcVar9 == (char *)0x0) ||
               (eVar6 = strcat_s(lpBuffer,(ulong)cch,pcVar9), eVar6 == 0)) {
              DVar5 = 0;
              bVar3 = false;
              goto LAB_0031e846;
            }
          }
          if (PAL_InitializeChakraCoreCalled == false) {
LAB_0031e881:
            abort();
          }
          DVar5 = 0x7a;
          bVar3 = true;
        }
      }
LAB_0031e846:
      InternalFree(__s);
      goto LAB_0031e84b;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0031e881;
    DVar5 = 8;
  }
  bVar3 = true;
LAB_0031e84b:
  DVar2 = 3;
  if (!bVar3) {
    DVar2 = DVar5;
  }
  if (DVar5 != 0) {
    DVar2 = DVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return DVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalCanonicalizeRealPath(LPCSTR lpUnixPath, LPSTR lpBuffer, DWORD cch)
{
    PAL_ERROR palError = NO_ERROR;
    LPSTR lpRealPath = NULL;

#if !REALPATH_SUPPORTS_NONEXISTENT_FILES
    LPSTR lpExistingPath = NULL;
    LPSTR pchSeparator = NULL;
    LPSTR lpFilename = NULL;
    DWORD cchBuffer = 0;
    DWORD cchFilename = 0;
#endif // !REALPATH_SUPPORTS_NONEXISTENT_FILES
 
    if ( (lpUnixPath == NULL) || (lpBuffer == NULL) || (cch < PATH_MAX) )
    {
        ERROR ("Invalid argument to InternalCanonicalizeRealPath\n");
        palError = ERROR_INVALID_PARAMETER;
        goto LExitDontFree;
    }

#if REALPATH_SUPPORTS_NONEXISTENT_FILES
    lpRealPath = realpath(lpUnixPath, lpBuffer);
#else   // !REALPATH_SUPPORTS_NONEXISTENT_FILES

    lpExistingPath = InternalStrdup(lpUnixPath);
    if (lpExistingPath == NULL)
    {
        ERROR ("InternalStrdup failed with error %d\n", errno);
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto LExit;
    }

    pchSeparator = strrchr(lpExistingPath, '/');
    if (pchSeparator == NULL)
    {
        char pszCwdBuffer[MAXPATHLEN+1]; // MAXPATHLEN is for getcwd()
        DWORD cchCwdBuffer = sizeof(pszCwdBuffer)/sizeof(pszCwdBuffer[0]);

        if (getcwd(pszCwdBuffer, cchCwdBuffer) == NULL)
        {
            WARN("getcwd(NULL) failed with error %d\n", errno);
            palError = DIRGetLastErrorFromErrno();
            goto LExit;
        }

        lpRealPath = realpath(pszCwdBuffer, lpBuffer);
        if (lpRealPath == NULL)
        {
            WARN("realpath() failed with error %d\n", errno);
            palError = FILEGetLastErrorFromErrno();
#if defined(_AMD64_)
            // If we are here, then we tried to invoke realpath
            // against a directory.
            //
            // On Mac64, realpath implementation differs from Mac32
            // by *not* supporting invalid filenames in the path (while
            // Mac32 implementation does).
            //
            // Thus, if we are here, and the error code we see is
            // ERROR_FILE_NOT_FOUND, then we should map it to
            // ERROR_PATH_NOT_FOUND since it was a directory that
            // was not found (and not a file).
            if (palError == ERROR_FILE_NOT_FOUND)
            {
                // Since lpBuffer can be modified by the realpath call,
                // and can result in a truncated subset of the original buffer,
                // we use strstr as a level of safety.
                 if (strstr(pszCwdBuffer, lpBuffer) != 0)
                 {
                     palError = ERROR_PATH_NOT_FOUND;
                 }
            }
#endif // defined(_AMD64_)
            
            goto LExit;
        }
        lpFilename = lpExistingPath;
    }
    else
    {
#if defined(_AMD64_)
        bool fSetFilename = true;
        // Since realpath implementation cannot handle inexistent filenames,
        // check if we are going to truncate the "/" corresponding to the
        // root folder (e.g. case of "/Volumes"). If so:
        //
        // 1) Set the seperator to point to the NULL terminator of the specified
        //    file/folder name.
        //
        // 2) Null terminate lpBuffer
        //
        // 3) Since there is no explicit filename component in lpExistingPath (as
        //    we only have "/" corresponding to the root), set lpFilename to NULL,
        //    alongwith a flag indicating that it has already been set.
        if (pchSeparator == lpExistingPath)
        {
            pchSeparator = lpExistingPath+strlen(lpExistingPath);

            // Set the lpBuffer to NULL
            lpBuffer[0] = '\0';
            lpFilename = NULL;
            fSetFilename = false;
        }
        else
#endif // defined(_AMD64_)
            *pchSeparator = '\0';
            
        lpRealPath = realpath(lpExistingPath, lpBuffer);
        if (lpRealPath == NULL)
        {
            WARN("realpath() failed with error %d\n", errno);
            palError = FILEGetLastErrorFromErrno();

#if defined(_AMD64_)
            // If we are here, then we tried to invoke realpath
            // against a directory after stripping out the filename
            // from the original path.
            //
            // On Mac64, realpath implementation differs from Mac32
            // by *not* supporting invalid filenames in the path (while
            // Mac32 implementation does).
            //
            // Thus, if we are here, and the error code we see is
            // ERROR_FILE_NOT_FOUND, then we should map it to
            // ERROR_PATH_NOT_FOUND since it was a directory that
            // was not found (and not a file).
            if (palError == ERROR_FILE_NOT_FOUND)
            {
                // Since lpBuffer can be modified by the realpath call,
                // and can result in a truncated subset of the original buffer,
                // we use strstr as a level of safety.
                if (strstr(lpExistingPath, lpBuffer) != 0)
                 {
                     palError = ERROR_PATH_NOT_FOUND;
                 }
            }
#endif // defined(_AMD64_)

            goto LExit;
        }

#if defined(_AMD64_)
        if (fSetFilename == true)
#endif // defined(_AMD64_)
            lpFilename = pchSeparator + 1;
    }

    cchBuffer = strlen(lpBuffer);

#if defined(_AMD64_)
    if (lpFilename == NULL)
        cchFilename = 0;
    else
#endif // _AMD64_
        cchFilename = strlen(lpFilename);

    // Append the file name.
    // 2 is for "/" and NULL
    if (cchBuffer + cchFilename + 2 > cch)
    {
        ERROR ("Provided buffer size (%d) is smaller than the required (%d)\n", 
                cch, cchBuffer + cchFilename + 2);
        palError = ERROR_INSUFFICIENT_BUFFER;
        lpRealPath = NULL;
        goto LExit;
    }

    lpBuffer[cchBuffer] = '/';
    lpBuffer[cchBuffer+1] = '\0';

#if defined(_AMD64_)
    if (lpFilename == NULL)
        goto LExit;
#endif // _AMD64_

    if (strcat_s(lpBuffer, cch, lpFilename) != SAFECRT_SUCCESS)
    {
        ERROR ("strcat_s failed!\n");
        palError = ERROR_INSUFFICIENT_BUFFER;
        lpRealPath = NULL;

        // Doing a goto here since we want to exit now. This will work
        // incase someone else adds another if clause below us.
        goto LExit;
    }

LExit:
    if (lpExistingPath != NULL)
    {
        InternalFree(lpExistingPath);
    }
#endif // REALPATH_SUPPORTS_NONEXISTENT_FILES

LExitDontFree:
    if ((palError == NO_ERROR) && (lpRealPath == NULL))
    {
        // convert all these into ERROR_PATH_NOT_FOUND
        palError = ERROR_PATH_NOT_FOUND;
    }

    return palError;
}